

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O2

void __thiscall
vkt::QueryPool::anon_unknown_0::StateObjects::StateObjects
          (StateObjects *this,DeviceInterface *vk,Context *context,int numVertices,
          VkPrimitiveTopology primitive)

{
  VkFormat _format;
  VkImage VVar1;
  ProgramCollection<vk::ProgramBinary> *pPVar2;
  VkSubpassDescription subpass;
  StencilOpState _front;
  VkAttachmentDescription attachment;
  VkAttachmentDescription attachment_00;
  StencilOpState _back;
  Move<vk::Handle<(vk::HandleType)17>_> *pMVar3;
  Move<vk::Handle<(vk::HandleType)13>_> *pMVar4;
  Move<vk::Handle<(vk::HandleType)18>_> *this_00;
  Move<vk::Handle<(vk::HandleType)23>_> *this_01;
  Move<vk::Handle<(vk::HandleType)16>_> *this_02;
  SharedPtr<vkt::Draw::Image> *this_03;
  VkDevice device;
  Allocator *pAVar5;
  ProgramBinary *pPVar6;
  long lVar7;
  ImageCreateInfo *pIVar8;
  undefined8 *puVar9;
  byte bVar10;
  VkExtent3D _extent;
  VkExtent3D _extent_00;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  VkAttachmentReference *_colorAttachments;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  deUint32 dVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uStack_62c;
  allocator_type local_621;
  Move<vk::Handle<(vk::HandleType)17>_> *local_620;
  Move<vk::Handle<(vk::HandleType)13>_> *local_618;
  Move<vk::Handle<(vk::HandleType)13>_> *local_610;
  uint local_604;
  VkPrimitiveTopology local_600;
  value_type_conflict1 local_5fc;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachments;
  ImageCreateInfo depthImageCreateInfo;
  VkAttachmentReference colorAttachmentReference;
  pointer pHStack_520;
  pointer local_518;
  VkAllocationCallbacks *pVStack_510;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_508;
  SharedPtr<vkt::Draw::Buffer> *local_4e0;
  Move<vk::Handle<(vk::HandleType)18>_> *local_4d8;
  Move<vk::Handle<(vk::HandleType)23>_> *local_4d0;
  Move<vk::Handle<(vk::HandleType)16>_> *local_4c8;
  SharedPtr<vkt::Draw::Image> *local_4c0;
  ImageViewCreateInfo depthViewInfo;
  ImageViewCreateInfo attachmentViewInfo;
  _Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_3f8;
  _Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_3e0;
  VkRect2D scissor;
  VkStencilOpState local_3b8;
  VkStencilOpState local_398;
  VkVertexInputBindingDescription vf_binding_desc;
  VkVertexInputAttributeDescription vf_attribute_desc;
  Attachment attachmentState;
  ImageCreateInfo colorImageCreateInfo;
  VkViewport viewport;
  
  bVar10 = 0;
  this->m_context = context;
  local_4d8 = &this->m_pipeline;
  local_4c8 = &this->m_pipelineLayout;
  local_4c0 = &this->m_DepthImage;
  local_610 = &this->m_attachmentView;
  local_618 = &this->m_depthiew;
  local_620 = &this->m_renderPass;
  local_4d0 = &this->m_framebuffer;
  local_4e0 = &this->m_vertexBuffer;
  memset(local_4d8,0,0xf0);
  this->m_colorAttachmentFormat = VK_FORMAT_R8G8B8A8_UNORM;
  device = Context::getDevice(context);
  _extent.depth = 1;
  _extent.width = 0x80;
  _extent.height = 0x80;
  Draw::ImageCreateInfo::ImageCreateInfo
            (&colorImageCreateInfo,VK_IMAGE_TYPE_2D,this->m_colorAttachmentFormat,_extent,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x11,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pAVar5 = Context::getDefaultAllocator(this->m_context);
  Draw::Image::createAndAlloc
            ((Image *)&depthImageCreateInfo,vk,device,&colorImageCreateInfo.super_VkImageCreateInfo,
             pAVar5,(MemoryRequirement)0x0);
  local_604 = numVertices;
  local_600 = primitive;
  de::SharedPtr<vkt::Draw::Image>::operator=
            (&this->m_colorAttachmentImage,(SharedPtr<vkt::Draw::Image> *)&depthImageCreateInfo);
  de::SharedPtr<vkt::Draw::Image>::~SharedPtr((SharedPtr<vkt::Draw::Image> *)&depthImageCreateInfo);
  VVar1.m_internal =
       (((this->m_colorAttachmentImage).m_ptr)->m_object).
       super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  _format = this->m_colorAttachmentFormat;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&depthImageCreateInfo,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G
             ,VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  uVar25 = 1;
  uStack_62c = 0;
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            (&attachmentViewInfo,VVar1,VK_IMAGE_VIEW_TYPE_2D,_format,
             (VkComponentMapping *)&depthImageCreateInfo,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&depthViewInfo,vk,device,
             &attachmentViewInfo.super_VkImageViewCreateInfo,(VkAllocationCallbacks *)0x0);
  pMVar4 = local_610;
  depthImageCreateInfo.super_VkImageCreateInfo.flags =
       depthViewInfo.super_VkImageViewCreateInfo.flags;
  depthImageCreateInfo.super_VkImageCreateInfo.imageType =
       depthViewInfo.super_VkImageViewCreateInfo._20_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.format =
       (undefined4)depthViewInfo.super_VkImageViewCreateInfo.image.m_internal;
  depthImageCreateInfo.super_VkImageCreateInfo.extent.width =
       depthViewInfo.super_VkImageViewCreateInfo.image.m_internal._4_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.sType =
       depthViewInfo.super_VkImageViewCreateInfo.sType;
  depthImageCreateInfo.super_VkImageCreateInfo._4_4_ =
       depthViewInfo.super_VkImageViewCreateInfo._4_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.pNext =
       depthViewInfo.super_VkImageViewCreateInfo.pNext;
  depthViewInfo.super_VkImageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthViewInfo.super_VkImageViewCreateInfo._4_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.pNext = (void *)0x0;
  depthViewInfo.super_VkImageViewCreateInfo.flags = 0;
  depthViewInfo.super_VkImageViewCreateInfo._20_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.image.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&local_610->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
       (VkDevice)depthImageCreateInfo.super_VkImageCreateInfo._16_8_;
  (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)depthImageCreateInfo.super_VkImageCreateInfo._24_8_;
  (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       depthImageCreateInfo.super_VkImageCreateInfo._0_8_;
  (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&depthViewInfo);
  uVar13 = 0;
  uVar14 = 0;
  _extent_00.depth = 1;
  _extent_00.width = 0x80;
  _extent_00.height = 0x80;
  uVar11 = uVar25;
  uVar12 = uStack_62c;
  Draw::ImageCreateInfo::ImageCreateInfo
            (&depthImageCreateInfo,VK_IMAGE_TYPE_2D,VK_FORMAT_D16_UNORM,_extent_00,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x20,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  this_03 = local_4c0;
  pAVar5 = Context::getDefaultAllocator(this->m_context);
  Draw::Image::createAndAlloc
            ((Image *)&depthViewInfo,vk,device,&depthImageCreateInfo.super_VkImageCreateInfo,pAVar5,
             (MemoryRequirement)0x0);
  de::SharedPtr<vkt::Draw::Image>::operator=(this_03,(SharedPtr<vkt::Draw::Image> *)&depthViewInfo);
  de::SharedPtr<vkt::Draw::Image>::~SharedPtr((SharedPtr<vkt::Draw::Image> *)&depthViewInfo);
  VVar1.m_internal =
       (this_03->m_ptr->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
       m_internal;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&attachments,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G,
             VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            (&depthViewInfo,VVar1,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_D16_UNORM,
             (VkComponentMapping *)&attachments,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&colorAttachmentReference,vk,device,
             &depthViewInfo.super_VkImageViewCreateInfo,(VkAllocationCallbacks *)0x0);
  pMVar4 = local_618;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_518;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)colorAttachmentReference;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pHStack_520;
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&local_618->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
       (VkDevice)
       attachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator = pVStack_510;
  (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       (deUint64)
       attachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       attachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  _colorAttachments = &colorAttachmentReference;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)_colorAttachments);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&depthImageCreateInfo.m_queueFamilyIndices.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&colorImageCreateInfo.m_queueFamilyIndices.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  Draw::RenderPassCreateInfo::RenderPassCreateInfo
            ((RenderPassCreateInfo *)&colorImageCreateInfo,0,(VkAttachmentDescription *)0x0,0,
             (VkSubpassDescription *)0x0,0,(VkSubpassDependency *)0x0);
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&depthImageCreateInfo,this->m_colorAttachmentFormat,
             VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_CLEAR,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_IMAGE_LAYOUT_GENERAL,VK_IMAGE_LAYOUT_GENERAL);
  attachment.samples = (int)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
  attachment.flags = depthImageCreateInfo.super_VkImageCreateInfo.sType;
  attachment.format = depthImageCreateInfo.super_VkImageCreateInfo._4_4_;
  attachment.loadOp = (int)((ulong)depthImageCreateInfo.super_VkImageCreateInfo.pNext >> 0x20);
  attachment.storeOp = depthImageCreateInfo.super_VkImageCreateInfo.flags;
  attachment.stencilLoadOp = depthImageCreateInfo.super_VkImageCreateInfo.imageType;
  attachment.stencilStoreOp = depthImageCreateInfo.super_VkImageCreateInfo.format;
  attachment.initialLayout = depthImageCreateInfo.super_VkImageCreateInfo.extent.width;
  attachment.finalLayout = depthImageCreateInfo.super_VkImageCreateInfo.extent.height;
  Draw::RenderPassCreateInfo::addAttachment
            ((RenderPassCreateInfo *)&colorImageCreateInfo,attachment);
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&depthImageCreateInfo,VK_FORMAT_D16_UNORM,
             VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_CLEAR,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
  dVar22 = depthImageCreateInfo.super_VkImageCreateInfo.extent.width;
  attachment_00.samples = (int)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
  attachment_00.flags = depthImageCreateInfo.super_VkImageCreateInfo.sType;
  attachment_00.format = depthImageCreateInfo.super_VkImageCreateInfo._4_4_;
  attachment_00.loadOp = (int)((ulong)depthImageCreateInfo.super_VkImageCreateInfo.pNext >> 0x20);
  attachment_00.storeOp = depthImageCreateInfo.super_VkImageCreateInfo.flags;
  attachment_00.stencilLoadOp = depthImageCreateInfo.super_VkImageCreateInfo.imageType;
  attachment_00.stencilStoreOp = depthImageCreateInfo.super_VkImageCreateInfo.format;
  attachment_00.initialLayout = dVar22;
  attachment_00.finalLayout = depthImageCreateInfo.super_VkImageCreateInfo.extent.height;
  Draw::RenderPassCreateInfo::addAttachment
            ((RenderPassCreateInfo *)&colorImageCreateInfo,attachment_00);
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_GENERAL;
  uVar23 = 0;
  uVar24 = 0;
  uVar19 = 1;
  uVar20 = 3;
  uVar21 = 0;
  uVar17 = 0;
  uVar18 = 0;
  uVar15 = 0x66d019;
  uVar16 = 0;
  Draw::SubpassDescription::SubpassDescription
            ((SubpassDescription *)&depthImageCreateInfo,VK_PIPELINE_BIND_POINT_GRAPHICS,0,0,
             (VkAttachmentReference *)0x0,1,_colorAttachments,(VkAttachmentReference *)0x0,
             (VkAttachmentReference)0x300000001,0,(deUint32 *)0x0);
  pIVar8 = &depthImageCreateInfo;
  puVar9 = (undefined8 *)&stack0xfffffffffffff988;
  for (lVar7 = 9; this_02 = local_4c8, lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar9 = *(undefined8 *)&pIVar8->super_VkImageCreateInfo;
    pIVar8 = (ImageCreateInfo *)((long)pIVar8 + (ulong)bVar10 * -0x10 + 8);
    puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
  }
  subpass.pipelineBindPoint = uStack_62c;
  subpass.flags = uVar25;
  subpass.inputAttachmentCount = uVar11;
  subpass._12_4_ = uVar12;
  subpass.pInputAttachments._0_4_ = uVar13;
  subpass.pInputAttachments._4_4_ = uVar14;
  subpass.colorAttachmentCount = uVar15;
  subpass._28_4_ = uVar16;
  subpass.pColorAttachments._0_4_ = (int)_colorAttachments;
  subpass.pColorAttachments._4_4_ = (int)((ulong)_colorAttachments >> 0x20);
  subpass.pResolveAttachments._0_4_ = uVar17;
  subpass.pResolveAttachments._4_4_ = uVar18;
  subpass.pDepthStencilAttachment._0_4_ = uVar19;
  subpass.pDepthStencilAttachment._4_4_ = uVar20;
  subpass.preserveAttachmentCount = uVar21;
  subpass._60_4_ = dVar22;
  subpass.pPreserveAttachments._0_4_ = uVar23;
  subpass.pPreserveAttachments._4_4_ = uVar24;
  Draw::RenderPassCreateInfo::addSubpass((RenderPassCreateInfo *)&colorImageCreateInfo,subpass);
  Draw::SubpassDescription::~SubpassDescription((SubpassDescription *)&depthImageCreateInfo);
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&attachmentViewInfo,vk,device,
             (VkRenderPassCreateInfo *)&colorImageCreateInfo,(VkAllocationCallbacks *)0x0);
  pMVar3 = local_620;
  depthImageCreateInfo.super_VkImageCreateInfo.flags =
       attachmentViewInfo.super_VkImageViewCreateInfo.flags;
  depthImageCreateInfo.super_VkImageCreateInfo.imageType =
       attachmentViewInfo.super_VkImageViewCreateInfo._20_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.format =
       (undefined4)attachmentViewInfo.super_VkImageViewCreateInfo.image.m_internal;
  depthImageCreateInfo.super_VkImageCreateInfo.extent.width =
       attachmentViewInfo.super_VkImageViewCreateInfo.image.m_internal._4_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.sType =
       attachmentViewInfo.super_VkImageViewCreateInfo.sType;
  depthImageCreateInfo.super_VkImageCreateInfo._4_4_ =
       attachmentViewInfo.super_VkImageViewCreateInfo._4_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.pNext =
       attachmentViewInfo.super_VkImageViewCreateInfo.pNext;
  attachmentViewInfo.super_VkImageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  attachmentViewInfo.super_VkImageViewCreateInfo._4_4_ = 0;
  attachmentViewInfo.super_VkImageViewCreateInfo.pNext = (void *)0x0;
  attachmentViewInfo.super_VkImageViewCreateInfo.flags = 0;
  attachmentViewInfo.super_VkImageViewCreateInfo._20_4_ = 0;
  attachmentViewInfo.super_VkImageViewCreateInfo.image.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::reset
            (&local_620->super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_device =
       (VkDevice)depthImageCreateInfo.super_VkImageCreateInfo._16_8_;
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)depthImageCreateInfo.super_VkImageCreateInfo._24_8_;
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
       depthImageCreateInfo.super_VkImageCreateInfo._0_8_;
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&attachmentViewInfo);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  vector(&attachments,2,(allocator_type *)&depthImageCreateInfo);
  this_01 = local_4d0;
  (attachments.
   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->m_internal =
       (local_610->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].m_internal =
       (local_618->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  Draw::FramebufferCreateInfo::FramebufferCreateInfo
            ((FramebufferCreateInfo *)&depthImageCreateInfo,
             (VkRenderPass)
             (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal,
             &attachments,0x80,0x80,1);
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&depthViewInfo,vk,device,
             (VkFramebufferCreateInfo *)&depthImageCreateInfo,(VkAllocationCallbacks *)0x0);
  attachmentViewInfo.super_VkImageViewCreateInfo.flags =
       depthViewInfo.super_VkImageViewCreateInfo.flags;
  attachmentViewInfo.super_VkImageViewCreateInfo._20_4_ =
       depthViewInfo.super_VkImageViewCreateInfo._20_4_;
  attachmentViewInfo.super_VkImageViewCreateInfo.image =
       depthViewInfo.super_VkImageViewCreateInfo.image;
  attachmentViewInfo.super_VkImageViewCreateInfo.sType =
       depthViewInfo.super_VkImageViewCreateInfo.sType;
  attachmentViewInfo.super_VkImageViewCreateInfo._4_4_ =
       depthViewInfo.super_VkImageViewCreateInfo._4_4_;
  attachmentViewInfo.super_VkImageViewCreateInfo.pNext =
       depthViewInfo.super_VkImageViewCreateInfo.pNext;
  depthViewInfo.super_VkImageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthViewInfo.super_VkImageViewCreateInfo._4_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.pNext = (void *)0x0;
  depthViewInfo.super_VkImageViewCreateInfo.flags = 0;
  depthViewInfo.super_VkImageViewCreateInfo._20_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.image.m_internal = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_device =
       (VkDevice)attachmentViewInfo.super_VkImageViewCreateInfo._16_8_;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)attachmentViewInfo.super_VkImageViewCreateInfo.image.m_internal;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal =
       attachmentViewInfo.super_VkImageViewCreateInfo._0_8_;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)attachmentViewInfo.super_VkImageViewCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&depthViewInfo);
  std::
  _Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  ~_Vector_base(&attachments.
                 super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               );
  Draw::RenderPassCreateInfo::~RenderPassCreateInfo((RenderPassCreateInfo *)&colorImageCreateInfo);
  pPVar2 = this->m_context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&depthImageCreateInfo,"vert",(allocator<char> *)&attachmentViewInfo);
  this_00 = local_4d8;
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,(string *)&depthImageCreateInfo);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&colorImageCreateInfo,vk,device,pPVar6,0);
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)colorImageCreateInfo.super_VkImageCreateInfo._16_8_;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)colorImageCreateInfo.super_VkImageCreateInfo._0_8_;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)colorImageCreateInfo.super_VkImageCreateInfo.pNext;
  colorImageCreateInfo.super_VkImageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorImageCreateInfo.super_VkImageCreateInfo._4_4_ = 0;
  colorImageCreateInfo.super_VkImageCreateInfo.pNext = (void *)0x0;
  colorImageCreateInfo.super_VkImageCreateInfo.flags = 0;
  colorImageCreateInfo.super_VkImageCreateInfo.imageType = VK_IMAGE_TYPE_1D;
  colorImageCreateInfo.super_VkImageCreateInfo.format = VK_FORMAT_UNDEFINED;
  colorImageCreateInfo.super_VkImageCreateInfo.extent.width = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&colorImageCreateInfo);
  std::__cxx11::string::~string((string *)&depthImageCreateInfo);
  pPVar2 = this->m_context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&depthImageCreateInfo,"frag",(allocator<char> *)&attachmentViewInfo);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,(string *)&depthImageCreateInfo);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&colorImageCreateInfo,vk,device,pPVar6,0);
  colorAttachmentReference.attachment = colorImageCreateInfo.super_VkImageCreateInfo.sType;
  colorAttachmentReference.layout = colorImageCreateInfo.super_VkImageCreateInfo._4_4_;
  colorImageCreateInfo.super_VkImageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorImageCreateInfo.super_VkImageCreateInfo._4_4_ = 0;
  colorImageCreateInfo.super_VkImageCreateInfo.pNext = (void *)0x0;
  colorImageCreateInfo.super_VkImageCreateInfo.flags = 0;
  colorImageCreateInfo.super_VkImageCreateInfo.imageType = VK_IMAGE_TYPE_1D;
  colorImageCreateInfo.super_VkImageCreateInfo.format = VK_FORMAT_UNDEFINED;
  colorImageCreateInfo.super_VkImageCreateInfo.extent.width = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&colorImageCreateInfo);
  std::__cxx11::string::~string((string *)&depthImageCreateInfo);
  Draw::PipelineCreateInfo::ColorBlendState::Attachment::Attachment
            (&attachmentState,0,VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,
             VK_BLEND_FACTOR_SRC_COLOR,VK_BLEND_FACTOR_DST_COLOR,VK_BLEND_OP_ADD,0xf);
  colorImageCreateInfo.super_VkImageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorImageCreateInfo.super_VkImageCreateInfo._4_4_ = 0;
  colorImageCreateInfo.super_VkImageCreateInfo.pNext = (void *)0x0;
  colorImageCreateInfo.super_VkImageCreateInfo.flags = 0;
  colorImageCreateInfo.super_VkImageCreateInfo.imageType = VK_IMAGE_TYPE_1D;
  Draw::PipelineLayoutCreateInfo::PipelineLayoutCreateInfo
            ((PipelineLayoutCreateInfo *)&attachmentViewInfo,
             (vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
              *)&colorImageCreateInfo,0,(VkPushConstantRange *)0x0);
  std::
  _Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
  ~_Vector_base((_Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                 *)&colorImageCreateInfo);
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&depthImageCreateInfo,vk,device,
             (VkPipelineLayoutCreateInfo *)&attachmentViewInfo,(VkAllocationCallbacks *)0x0);
  colorImageCreateInfo.super_VkImageCreateInfo.flags =
       depthImageCreateInfo.super_VkImageCreateInfo.flags;
  colorImageCreateInfo.super_VkImageCreateInfo.imageType =
       depthImageCreateInfo.super_VkImageCreateInfo.imageType;
  colorImageCreateInfo.super_VkImageCreateInfo.format =
       depthImageCreateInfo.super_VkImageCreateInfo.format;
  colorImageCreateInfo.super_VkImageCreateInfo.extent.width =
       depthImageCreateInfo.super_VkImageCreateInfo.extent.width;
  colorImageCreateInfo.super_VkImageCreateInfo.sType =
       depthImageCreateInfo.super_VkImageCreateInfo.sType;
  colorImageCreateInfo.super_VkImageCreateInfo._4_4_ =
       depthImageCreateInfo.super_VkImageCreateInfo._4_4_;
  colorImageCreateInfo.super_VkImageCreateInfo.pNext =
       depthImageCreateInfo.super_VkImageCreateInfo.pNext;
  depthImageCreateInfo.super_VkImageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthImageCreateInfo.super_VkImageCreateInfo._4_4_ = 0;
  depthImageCreateInfo.super_VkImageCreateInfo.pNext = (void *)0x0;
  depthImageCreateInfo.super_VkImageCreateInfo.flags = 0;
  depthImageCreateInfo.super_VkImageCreateInfo.imageType = VK_IMAGE_TYPE_1D;
  depthImageCreateInfo.super_VkImageCreateInfo.format = VK_FORMAT_UNDEFINED;
  depthImageCreateInfo.super_VkImageCreateInfo.extent.width = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::reset
            (&this_02->super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  (this_02->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_device =
       (VkDevice)colorImageCreateInfo.super_VkImageCreateInfo._16_8_;
  (this_02->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorImageCreateInfo.super_VkImageCreateInfo._24_8_;
  (this_02->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal =
       colorImageCreateInfo.super_VkImageCreateInfo._0_8_;
  (this_02->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)colorImageCreateInfo.super_VkImageCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&depthImageCreateInfo);
  depthViewInfo.super_VkImageViewCreateInfo.image.m_internal = (deUint64)&vf_binding_desc;
  vf_binding_desc.binding = 0;
  vf_binding_desc.stride = 0x10;
  vf_binding_desc.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  depthViewInfo.super_VkImageViewCreateInfo.sType =
       VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  depthViewInfo.super_VkImageViewCreateInfo.pNext = (void *)0x0;
  depthViewInfo.super_VkImageViewCreateInfo.components._0_8_ = &vf_attribute_desc;
  vf_attribute_desc.location = 0;
  vf_attribute_desc.binding = 0;
  vf_attribute_desc.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vf_attribute_desc.offset = 0;
  depthViewInfo.super_VkImageViewCreateInfo.flags = 0;
  depthViewInfo.super_VkImageViewCreateInfo._20_4_ = 1;
  depthViewInfo.super_VkImageViewCreateInfo.viewType = VK_IMAGE_VIEW_TYPE_2D;
  Draw::PipelineCreateInfo::PipelineCreateInfo
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineLayout)
             (this_02->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal,
             (VkRenderPass)
             (local_620->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal,0,
             0);
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&depthImageCreateInfo,
             (VkShaderModule)
             attachments.
             super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
             ._M_impl.super__Vector_impl_data._M_start,"main",VK_SHADER_STAGE_VERTEX_BIT);
  Draw::PipelineCreateInfo::addShader
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineShaderStageCreateInfo *)&depthImageCreateInfo);
  Draw::PipelineCreateInfo::PipelineShaderStage::PipelineShaderStage
            ((PipelineShaderStage *)&depthImageCreateInfo,(VkShaderModule)colorAttachmentReference,
             "main",VK_SHADER_STAGE_FRAGMENT_BIT);
  Draw::PipelineCreateInfo::addShader
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineShaderStageCreateInfo *)&depthImageCreateInfo);
  Draw::PipelineCreateInfo::InputAssemblerState::InputAssemblerState
            ((InputAssemblerState *)&depthImageCreateInfo,local_600,0);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineInputAssemblyStateCreateInfo *)&depthImageCreateInfo);
  Draw::PipelineCreateInfo::ColorBlendState::ColorBlendState
            ((ColorBlendState *)&depthImageCreateInfo,1,
             &attachmentState.super_VkPipelineColorBlendAttachmentState,0,VK_LOGIC_OP_COPY);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineColorBlendStateCreateInfo *)&depthImageCreateInfo);
  std::
  _Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
  ::~_Vector_base((_Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                   *)&depthImageCreateInfo.super_VkImageCreateInfo.usage);
  viewport.x = 0.0;
  viewport.y = 0.0;
  viewport.width = 128.0;
  viewport.height = 128.0;
  viewport.minDepth = 0.0;
  viewport.maxDepth = 1.0;
  scissor.offset.x = 0;
  scissor.offset.y = 0;
  scissor.extent.width = 0x80;
  scissor.extent.height = 0x80;
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::vector
            ((vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> *)&local_3e0,1,&viewport,
             (allocator_type *)&local_508);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::vector
            ((vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> *)&local_3f8,1,&scissor,
             (allocator_type *)&local_5fc);
  Draw::PipelineCreateInfo::ViewportState::ViewportState
            ((ViewportState *)&depthImageCreateInfo,1,
             (vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> *)&local_3e0,
             (vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> *)&local_3f8);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineViewportStateCreateInfo *)&depthImageCreateInfo);
  Draw::PipelineCreateInfo::ViewportState::~ViewportState((ViewportState *)&depthImageCreateInfo);
  std::_Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::~_Vector_base(&local_3f8);
  std::_Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>::~_Vector_base(&local_3e0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_398,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_3b8,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  _front.super_VkStencilOpState.depthFailOp = local_398.depthFailOp;
  _front.super_VkStencilOpState.failOp = local_398.failOp;
  _front.super_VkStencilOpState.passOp = local_398.passOp;
  _front.super_VkStencilOpState.compareOp = local_398.compareOp;
  _front.super_VkStencilOpState.compareMask = local_398.compareMask;
  _front.super_VkStencilOpState.writeMask = local_398.writeMask;
  _front.super_VkStencilOpState.reference = local_398.reference;
  _back.super_VkStencilOpState.depthFailOp = local_3b8.depthFailOp;
  _back.super_VkStencilOpState.failOp = local_3b8.failOp;
  _back.super_VkStencilOpState.passOp = local_3b8.passOp;
  _back.super_VkStencilOpState.compareOp = local_3b8.compareOp;
  _back.super_VkStencilOpState.compareMask = local_3b8.compareMask;
  _back.super_VkStencilOpState.writeMask = local_3b8.writeMask;
  _back.super_VkStencilOpState.reference = local_3b8.reference;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            ((DepthStencilState *)&depthImageCreateInfo,1,1,VK_COMPARE_OP_GREATER_OR_EQUAL,0,0,
             _front,_back,0.0,1.0);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineDepthStencilStateCreateInfo *)&depthImageCreateInfo);
  Draw::PipelineCreateInfo::RasterizerState::RasterizerState
            ((RasterizerState *)&depthImageCreateInfo,0,0,VK_POLYGON_MODE_FILL,0,
             VK_FRONT_FACE_CLOCKWISE,1,0.0,0.0,0.0,1.0);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineRasterizationStateCreateInfo *)&depthImageCreateInfo);
  local_5fc = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_508,1,&local_5fc,
             &local_621);
  Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
            ((MultiSampleState *)&depthImageCreateInfo,VK_SAMPLE_COUNT_1_BIT,0,0.0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_508,false,false);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineMultisampleStateCreateInfo *)&depthImageCreateInfo);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
             &depthImageCreateInfo.super_VkImageCreateInfo.samples);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_508);
  Draw::PipelineCreateInfo::addState
            ((PipelineCreateInfo *)&colorImageCreateInfo,
             (VkPipelineVertexInputStateCreateInfo *)&depthViewInfo);
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_508,vk,device,(VkPipelineCache)0x0,
             (VkGraphicsPipelineCreateInfo *)&colorImageCreateInfo,(VkAllocationCallbacks *)0x0);
  depthImageCreateInfo.super_VkImageCreateInfo._16_8_ = local_508.m_data.deleter.m_device;
  depthImageCreateInfo.super_VkImageCreateInfo._24_8_ = local_508.m_data.deleter.m_allocator;
  depthImageCreateInfo.super_VkImageCreateInfo._0_8_ = local_508.m_data.object.m_internal;
  depthImageCreateInfo.super_VkImageCreateInfo.pNext = local_508.m_data.deleter.m_deviceIface;
  local_508.m_data.object.m_internal = 0;
  local_508.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_508.m_data.deleter.m_device = (VkDevice)0x0;
  local_508.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_device =
       (VkDevice)depthImageCreateInfo.super_VkImageCreateInfo._16_8_;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)depthImageCreateInfo.super_VkImageCreateInfo._24_8_;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
       depthImageCreateInfo.super_VkImageCreateInfo._0_8_;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_508);
  Draw::PipelineCreateInfo::~PipelineCreateInfo((PipelineCreateInfo *)&colorImageCreateInfo);
  Draw::PipelineLayoutCreateInfo::~PipelineLayoutCreateInfo
            ((PipelineLayoutCreateInfo *)&attachmentViewInfo);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&colorAttachmentReference);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&attachments);
  Draw::BufferCreateInfo::BufferCreateInfo
            ((BufferCreateInfo *)&colorImageCreateInfo,(ulong)local_604 << 4,0x20,
             VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0);
  pAVar5 = Context::getDefaultAllocator(this->m_context);
  Draw::Buffer::createAndAlloc
            ((Buffer *)&depthImageCreateInfo,vk,device,(VkBufferCreateInfo *)&colorImageCreateInfo,
             pAVar5,(MemoryRequirement)0x1);
  de::SharedPtr<vkt::Draw::Buffer>::operator=
            (local_4e0,(SharedPtr<vkt::Draw::Buffer> *)&depthImageCreateInfo);
  de::SharedPtr<vkt::Draw::Buffer>::release((SharedPtr<vkt::Draw::Buffer> *)&depthImageCreateInfo);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
             &colorImageCreateInfo.super_VkImageCreateInfo.usage);
  return;
}

Assistant:

StateObjects::StateObjects (const vk::DeviceInterface&vk, vkt::Context &context, const int numVertices, vk::VkPrimitiveTopology primitive)
	: m_context(context)
	, m_colorAttachmentFormat(vk::VK_FORMAT_R8G8B8A8_UNORM)

{
	vk::VkFormat		depthFormat = vk::VK_FORMAT_D16_UNORM;
	const vk::VkDevice	device		= m_context.getDevice();

	//attachment images and views
	{
		vk::VkExtent3D imageExtent =
		{
			WIDTH,	// width;
			HEIGHT,	// height;
			1		// depth;
		};

		const ImageCreateInfo colorImageCreateInfo(vk::VK_IMAGE_TYPE_2D, m_colorAttachmentFormat, imageExtent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT, vk::VK_IMAGE_TILING_OPTIMAL,
												   vk::VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT);

		m_colorAttachmentImage	= Image::createAndAlloc(vk, device, colorImageCreateInfo, m_context.getDefaultAllocator());

		const ImageViewCreateInfo attachmentViewInfo(m_colorAttachmentImage->object(), vk::VK_IMAGE_VIEW_TYPE_2D, m_colorAttachmentFormat);
		m_attachmentView		= vk::createImageView(vk, device, &attachmentViewInfo);

		ImageCreateInfo depthImageCreateInfo(vk::VK_IMAGE_TYPE_2D, depthFormat, imageExtent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT, vk::VK_IMAGE_TILING_OPTIMAL,
			vk::VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT);

		m_DepthImage			= Image::createAndAlloc(vk, device, depthImageCreateInfo, m_context.getDefaultAllocator());

		// Construct a depth  view from depth image
		const ImageViewCreateInfo depthViewInfo(m_DepthImage->object(), vk::VK_IMAGE_VIEW_TYPE_2D, depthFormat);
		m_depthiew				= vk::createImageView(vk, device, &depthViewInfo);
	}

	{
		// Renderpass and Framebuffer

		RenderPassCreateInfo renderPassCreateInfo;
		renderPassCreateInfo.addAttachment(AttachmentDescription(m_colorAttachmentFormat,									// format
																	vk::VK_SAMPLE_COUNT_1_BIT,								// samples
																	vk::VK_ATTACHMENT_LOAD_OP_CLEAR,						// loadOp
																	vk::VK_ATTACHMENT_STORE_OP_DONT_CARE,					// storeOp
																	vk::VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// stencilLoadOp
																	vk::VK_ATTACHMENT_STORE_OP_DONT_CARE,					// stencilLoadOp
																	vk::VK_IMAGE_LAYOUT_GENERAL,							// initialLauout
																	vk::VK_IMAGE_LAYOUT_GENERAL));							// finalLayout

		renderPassCreateInfo.addAttachment(AttachmentDescription(depthFormat,												// format
																 vk::VK_SAMPLE_COUNT_1_BIT,									// samples
																 vk::VK_ATTACHMENT_LOAD_OP_CLEAR,							// loadOp
																 vk::VK_ATTACHMENT_STORE_OP_DONT_CARE,						// storeOp
																 vk::VK_ATTACHMENT_LOAD_OP_DONT_CARE,						// stencilLoadOp
																 vk::VK_ATTACHMENT_STORE_OP_DONT_CARE,						// stencilLoadOp
																 vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,		// initialLauout
																 vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL));	// finalLayout

		const vk::VkAttachmentReference colorAttachmentReference =
		{
			0,															// attachment
			vk::VK_IMAGE_LAYOUT_GENERAL									// layout
		};

		const vk::VkAttachmentReference depthAttachmentReference =
		{
			1,															// attachment
			vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL		// layout
		};

		renderPassCreateInfo.addSubpass(SubpassDescription(vk::VK_PIPELINE_BIND_POINT_GRAPHICS,					// pipelineBindPoint
														   0,													// flags
														   0,													// inputCount
														   DE_NULL,												// pInputAttachments
														   1,													// colorCount
														   &colorAttachmentReference,							// pColorAttachments
														   DE_NULL,												// pResolveAttachments
														   depthAttachmentReference,							// depthStencilAttachment
														   0,													// preserveCount
														   DE_NULL));											// preserveAttachments

		m_renderPass = vk::createRenderPass(vk, device, &renderPassCreateInfo);

		std::vector<vk::VkImageView> attachments(2);
		attachments[0] = *m_attachmentView;
		attachments[1] = *m_depthiew;

		FramebufferCreateInfo framebufferCreateInfo(*m_renderPass, attachments, WIDTH, HEIGHT, 1);
		m_framebuffer = vk::createFramebuffer(vk, device, &framebufferCreateInfo);
	}

	{
		// Pipeline

		vk::Unique<vk::VkShaderModule> vs(vk::createShaderModule(vk, device, m_context.getBinaryCollection().get("vert"), 0));
		vk::Unique<vk::VkShaderModule> fs(vk::createShaderModule(vk, device, m_context.getBinaryCollection().get("frag"), 0));

		const PipelineCreateInfo::ColorBlendState::Attachment attachmentState;

		const PipelineLayoutCreateInfo pipelineLayoutCreateInfo;
		m_pipelineLayout = vk::createPipelineLayout(vk, device, &pipelineLayoutCreateInfo);

		const vk::VkVertexInputBindingDescription vf_binding_desc		=
		{
			0,																// binding;
			4 * (deUint32)sizeof(float),									// stride;
			vk::VK_VERTEX_INPUT_RATE_VERTEX									// inputRate
		};

		const vk::VkVertexInputAttributeDescription vf_attribute_desc	=
		{
			0,																// location;
			0,																// binding;
			vk::VK_FORMAT_R32G32B32A32_SFLOAT,								// format;
			0																// offset;
		};

		const vk::VkPipelineVertexInputStateCreateInfo vf_info			=
		{																	// sType;
			vk::VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,	// pNext;
			NULL,															// flags;
			0u,																// vertexBindingDescriptionCount;
			1,																// pVertexBindingDescriptions;
			&vf_binding_desc,												// vertexAttributeDescriptionCount;
			1,																// pVertexAttributeDescriptions;
			&vf_attribute_desc
		};

		PipelineCreateInfo pipelineCreateInfo(*m_pipelineLayout, *m_renderPass, 0, 0);
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*vs, "main", vk::VK_SHADER_STAGE_VERTEX_BIT));
		pipelineCreateInfo.addShader(PipelineCreateInfo::PipelineShaderStage(*fs, "main", vk::VK_SHADER_STAGE_FRAGMENT_BIT));
		pipelineCreateInfo.addState(PipelineCreateInfo::InputAssemblerState(primitive));
		pipelineCreateInfo.addState(PipelineCreateInfo::ColorBlendState(1, &attachmentState));
		const vk::VkViewport viewport	=
		{
			0,		// float x;
			0,		// float y;
			WIDTH,	// float width;
			HEIGHT,	// float height;
			0.0f,	// float minDepth;
			1.0f	// float maxDepth;
		};

		const vk::VkRect2D scissor		=
		{
			{
				0,		// deInt32 x
				0,		// deInt32 y
			},		// VkOffset2D	offset;
			{
				WIDTH,	// deInt32 width;
				HEIGHT,	// deInt32 height
			},		// VkExtent2D	extent;
		};
		pipelineCreateInfo.addState(PipelineCreateInfo::ViewportState(1, std::vector<vk::VkViewport>(1, viewport), std::vector<vk::VkRect2D>(1, scissor)));
		pipelineCreateInfo.addState(PipelineCreateInfo::DepthStencilState(true, true, vk::VK_COMPARE_OP_GREATER_OR_EQUAL));
		pipelineCreateInfo.addState(PipelineCreateInfo::RasterizerState());
		pipelineCreateInfo.addState(PipelineCreateInfo::MultiSampleState());
		pipelineCreateInfo.addState(vf_info);
		m_pipeline = vk::createGraphicsPipeline(vk, device, DE_NULL, &pipelineCreateInfo);
	}

	{
		// Vertex buffer
		const size_t kBufferSize = numVertices * sizeof(tcu::Vec4);
		m_vertexBuffer = Buffer::createAndAlloc(vk, device, BufferCreateInfo(kBufferSize, vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), m_context.getDefaultAllocator(), vk::MemoryRequirement::HostVisible);
	}
}